

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateCommonBuilderMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  long lVar1;
  FieldDescriptor *field;
  MessageBuilderGenerator *pMVar2;
  bool bVar3;
  int iVar4;
  ImmutableFieldGenerator *pIVar5;
  OneofGeneratorInfo *pOVar6;
  Descriptor *pDVar7;
  Descriptor *descriptor;
  ulong uVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  undefined8 extraout_RDX_02;
  int iVar10;
  uint uVar11;
  OneofDescriptor *oneof;
  int i_2;
  int iVar12;
  uint uVar13;
  long lVar14;
  java *pjVar15;
  int i;
  long lVar16;
  string sStack_88;
  MessageBuilderGenerator *local_68;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_60;
  long local_58;
  string local_50;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&sStack_88,this->name_resolver_,this->descriptor_);
  io::Printer::Print(printer,
                     "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  maybeForceBuilderInitialization();\n}\n\n"
                     ,"classname",&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&sStack_88,this->name_resolver_,this->descriptor_);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print(printer,
                     "private Builder(\n    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n  super(parent);\n  maybeForceBuilderInitialization();\n}\n"
                     ,"classname",&sStack_88,"ver",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_88);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::Print(printer,
                     "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage$ver$\n          .alwaysUseFieldBuilders) {\n"
                     ,"ver",&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  local_60 = &this->field_generators_;
  lVar14 = 0;
  for (lVar16 = 0; lVar16 < *(int *)(this->descriptor_ + 0x2c); lVar16 = lVar16 + 1) {
    lVar1 = *(long *)(this->descriptor_ + 0x30);
    if (*(long *)(lVar1 + 0x60 + lVar14) == 0) {
      pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (local_60,(FieldDescriptor *)(lVar1 + lVar14));
      (*pIVar5->_vptr_ImmutableFieldGenerator[0x10])(pIVar5,printer);
    }
    lVar14 = lVar14 + 0xa8;
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  io::Printer::Print(printer,"public Builder clear() {\n  super.clear();\n");
  io::Printer::Indent(printer);
  lVar14 = 0;
  for (lVar16 = 0; pDVar7 = this->descriptor_, lVar16 < *(int *)(pDVar7 + 0x2c); lVar16 = lVar16 + 1
      ) {
    if (*(long *)(*(long *)(pDVar7 + 0x30) + 0x60 + lVar14) == 0) {
      pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (local_60,(FieldDescriptor *)(*(long *)(pDVar7 + 0x30) + lVar14));
      (*pIVar5->_vptr_ImmutableFieldGenerator[8])(pIVar5,printer);
    }
    lVar14 = lVar14 + 0xa8;
  }
  lVar14 = 0;
  for (lVar16 = 0; lVar16 < *(int *)(pDVar7 + 0x38); lVar16 = lVar16 + 1) {
    pOVar6 = Context::GetOneofGeneratorInfo
                       (this->context_,(OneofDescriptor *)(*(long *)(pDVar7 + 0x40) + lVar14));
    io::Printer::Print(printer,"$oneof_name$Case_ = 0;\n$oneof_name$_ = null;\n","oneof_name",
                       &pOVar6->name);
    pDVar7 = this->descriptor_;
    lVar14 = lVar14 + 0x30;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return this;\n}\n\n");
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&sStack_88,this->name_resolver_,*(FileDescriptor **)(this->descriptor_ + 0x10));
  UniqueFileScopeIdentifier_abi_cxx11_(&local_50,(java *)this->descriptor_,descriptor);
  io::Printer::Print(printer,
                     "public com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                     ,"fileclass",&sStack_88,"identifier",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_88);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&sStack_88,this->name_resolver_,this->descriptor_);
  io::Printer::Print(printer,
                     "public $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
                     ,"classname",&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&sStack_88,this->name_resolver_,this->descriptor_);
  io::Printer::Print(printer,
                     "public $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\n"
                     ,"classname",&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  local_68 = this;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&sStack_88,this->name_resolver_,this->descriptor_);
  io::Printer::Print(printer,
                     "public $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
                     ,"classname",&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  io::Printer::Indent(printer);
  lVar14 = 0;
  iVar12 = 0;
  iVar10 = 0;
  for (lVar16 = 0; pDVar7 = local_68->descriptor_, lVar16 < *(int *)(pDVar7 + 0x2c);
      lVar16 = lVar16 + 1) {
    pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (local_60,(FieldDescriptor *)(*(long *)(pDVar7 + 0x30) + lVar14));
    iVar4 = (*pIVar5->_vptr_ImmutableFieldGenerator[3])(pIVar5);
    iVar12 = iVar12 + iVar4;
    iVar4 = (*pIVar5->_vptr_ImmutableFieldGenerator[2])(pIVar5);
    iVar10 = iVar10 + iVar4;
    lVar14 = lVar14 + 0xa8;
  }
  local_58 = CONCAT44(local_58._4_4_,(iVar10 + 0x1f) / 0x20);
  bVar3 = anon_unknown_10::GenerateHasBits(pDVar7);
  if (bVar3) {
    iVar10 = (iVar12 + 0x1f) / 0x20;
    uVar8 = (long)(iVar12 + 0x1f) % 0x20 & 0xffffffff;
    pjVar15 = (java *)0x0;
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    for (; iVar10 != (int)pjVar15; pjVar15 = (java *)(ulong)((int)pjVar15 + 1)) {
      GetBitFieldName_abi_cxx11_(&sStack_88,pjVar15,(int)uVar8);
      io::Printer::Print(printer,"int from_$bit_field_name$ = $bit_field_name$;\n","bit_field_name",
                         &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      uVar8 = extraout_RDX;
    }
    uVar13 = 0;
    uVar11 = 0;
    if (0 < (int)(uint)local_58) {
      uVar11 = (uint)local_58;
    }
    for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      GetBitFieldName_abi_cxx11_(&sStack_88,(java *)(ulong)uVar13,(int)uVar8);
      io::Printer::Print(printer,"int to_$bit_field_name$ = 0;\n","bit_field_name",&sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      uVar8 = extraout_RDX_00;
    }
  }
  pMVar2 = local_68;
  lVar14 = 0;
  for (lVar16 = 0; pDVar7 = pMVar2->descriptor_, lVar16 < *(int *)(pDVar7 + 0x2c);
      lVar16 = lVar16 + 1) {
    pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (local_60,(FieldDescriptor *)(*(long *)(pDVar7 + 0x30) + lVar14));
    (*pIVar5->_vptr_ImmutableFieldGenerator[10])(pIVar5,printer);
    lVar14 = lVar14 + 0xa8;
  }
  bVar3 = anon_unknown_10::GenerateHasBits(pDVar7);
  if (bVar3) {
    pjVar15 = (java *)0x0;
    uVar9 = extraout_RDX_01;
    iVar10 = (uint)local_58;
    if ((int)(uint)local_58 < 1) {
      iVar10 = 0;
    }
    for (; iVar10 != (int)pjVar15; pjVar15 = (java *)(ulong)((int)pjVar15 + 1)) {
      GetBitFieldName_abi_cxx11_(&sStack_88,pjVar15,(int)uVar9);
      io::Printer::Print(printer,"result.$bit_field_name$ = to_$bit_field_name$;\n","bit_field_name"
                         ,&sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      uVar9 = extraout_RDX_02;
    }
  }
  lVar14 = 0;
  for (lVar16 = 0; lVar16 < *(int *)(pMVar2->descriptor_ + 0x38); lVar16 = lVar16 + 1) {
    pOVar6 = Context::GetOneofGeneratorInfo
                       (pMVar2->context_,
                        (OneofDescriptor *)(*(long *)(pMVar2->descriptor_ + 0x40) + lVar14));
    io::Printer::Print(printer,"result.$oneof_name$Case_ = $oneof_name$Case_;\n","oneof_name",
                       &pOVar6->name);
    lVar14 = lVar14 + 0x30;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  onBuilt();\n");
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&sStack_88,pMVar2->name_resolver_,pMVar2->descriptor_);
  io::Printer::Print(printer,"  return result;\n}\n\n","classname",&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  io::Printer::Print(printer,
                     "public Builder clone() {\n  return (Builder) super.clone();\n}\npublic Builder setField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    Object value) {\n  return (Builder) super.setField(field, value);\n}\npublic Builder clearField(\n    com.google.protobuf.Descriptors.FieldDescriptor field) {\n  return (Builder) super.clearField(field);\n}\npublic Builder clearOneof(\n    com.google.protobuf.Descriptors.OneofDescriptor oneof) {\n  return (Builder) super.clearOneof(oneof);\n}\npublic Builder setRepeatedField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    int index, Object value) {\n  return (Builder) super.setRepeatedField(field, index, value);\n}\npublic Builder addRepeatedField(\n    com.google.protobuf.Descriptors.FieldDescriptor field,\n    Object value) {\n  return (Builder) super.addRepeatedField(field, value);\n}\n"
                    );
  pDVar7 = pMVar2->descriptor_;
  if (0 < *(int *)(pDVar7 + 0x68)) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&sStack_88,pMVar2->name_resolver_,pDVar7);
    io::Printer::Print(printer,
                       "public <Type> Builder setExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, Type> extension,\n    Type value) {\n  return (Builder) super.setExtension(extension, value);\n}\npublic <Type> Builder setExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, java.util.List<Type>> extension,\n    int index, Type value) {\n  return (Builder) super.setExtension(extension, index, value);\n}\npublic <Type> Builder addExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, java.util.List<Type>> extension,\n    Type value) {\n  return (Builder) super.addExtension(extension, value);\n}\npublic <Type> Builder clearExtension(\n    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n        $classname$, ?> extension) {\n  return (Builder) super.clearExtension(extension);\n}\n"
                       ,"classname",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    pDVar7 = pMVar2->descriptor_;
  }
  bVar3 = Context::HasGeneratedMethods(pMVar2->context_,pDVar7);
  if (bVar3) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&sStack_88,pMVar2->name_resolver_,pMVar2->descriptor_);
    io::Printer::Print(printer,
                       "public Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
                       ,"classname",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&sStack_88,pMVar2->name_resolver_,pMVar2->descriptor_);
    io::Printer::Print(printer,
                       "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
                       ,"classname",&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    io::Printer::Indent(printer);
    lVar14 = 0;
    for (lVar16 = 0; pDVar7 = pMVar2->descriptor_, lVar16 < *(int *)(pDVar7 + 0x2c);
        lVar16 = lVar16 + 1) {
      if (*(long *)(*(long *)(pDVar7 + 0x30) + 0x60 + lVar14) == 0) {
        pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (local_60,(FieldDescriptor *)(*(long *)(pDVar7 + 0x30) + lVar14));
        (*pIVar5->_vptr_ImmutableFieldGenerator[9])(pIVar5,printer);
      }
      lVar14 = lVar14 + 0xa8;
    }
    lVar14 = 0;
    while (lVar14 < *(int *)(pDVar7 + 0x38)) {
      lVar16 = lVar14 * 0x30;
      local_58 = lVar14;
      pOVar6 = Context::GetOneofGeneratorInfo
                         (local_68->context_,(OneofDescriptor *)(*(long *)(pDVar7 + 0x40) + lVar16))
      ;
      io::Printer::Print(printer,"switch (other.get$oneof_capitalized_name$Case()) {\n",
                         "oneof_capitalized_name",&pOVar6->capitalized_name);
      io::Printer::Indent(printer);
      for (lVar14 = 0; pMVar2 = local_68,
          oneof = (OneofDescriptor *)(*(long *)(local_68->descriptor_ + 0x40) + lVar16),
          lVar14 < *(int *)(*(long *)(local_68->descriptor_ + 0x40) + 0x1c + lVar16);
          lVar14 = lVar14 + 1) {
        field = *(FieldDescriptor **)(*(long *)(oneof + 0x20) + lVar14 * 8);
        ToUpper(&sStack_88,*(string **)field);
        io::Printer::Print(printer,"case $field_name$: {\n","field_name",&sStack_88);
        std::__cxx11::string::~string((string *)&sStack_88);
        io::Printer::Indent(printer);
        pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (local_60,field);
        (*pIVar5->_vptr_ImmutableFieldGenerator[9])(pIVar5,printer);
        io::Printer::Print(printer,"break;\n");
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      pOVar6 = Context::GetOneofGeneratorInfo(local_68->context_,oneof);
      ToUpper(&sStack_88,&pOVar6->name);
      io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                         &sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pDVar7 = pMVar2->descriptor_;
      lVar14 = local_58 + 1;
    }
    io::Printer::Outdent(printer);
    pMVar2 = local_68;
    pDVar7 = local_68->descriptor_;
    if (0 < *(int *)(pDVar7 + 0x68)) {
      io::Printer::Print(printer,"  this.mergeExtensionFields(other);\n");
      pDVar7 = pMVar2->descriptor_;
    }
    if (*(int *)(*(long *)(pDVar7 + 0x10) + 0x8c) != 3) {
      io::Printer::Print(printer,"  this.mergeUnknownFields(other.unknownFields);\n");
    }
    io::Printer::Print(printer,"  onChanged();\n");
    io::Printer::Print(printer,"  return this;\n}\n\n");
  }
  return;
}

Assistant:

void MessageBuilderGenerator::
GenerateCommonBuilderMethods(io::Printer* printer) {
  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "  maybeForceBuilderInitialization();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "private Builder(\n"
    "    com.google.protobuf.GeneratedMessage$ver$.BuilderParent parent) {\n"
    "  super(parent);\n"
    "  maybeForceBuilderInitialization();\n"
    "}\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_),
    "ver", GeneratedCodeVersionSuffix());

  printer->Print(
    "private void maybeForceBuilderInitialization() {\n"
    "  if (com.google.protobuf.GeneratedMessage$ver$\n"
    "          .alwaysUseFieldBuilders) {\n",
    "ver", GeneratedCodeVersionSuffix());

  printer->Indent();
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateFieldBuilderInitializationCode(printer);
    }
  }
  printer->Outdent();
  printer->Outdent();

  printer->Print(
    "  }\n"
    "}\n");

  printer->Print(
    "public Builder clear() {\n"
    "  super.clear();\n");

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateBuilderClearCode(printer);
    }
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "$oneof_name$Case_ = 0;\n"
      "$oneof_name$_ = null;\n",
      "oneof_name", context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
  }

  printer->Outdent();

  printer->Print(
    "  return this;\n"
    "}\n"
    "\n");

  printer->Print(
    "public com.google.protobuf.Descriptors.Descriptor\n"
    "    getDescriptorForType() {\n"
    "  return $fileclass$.internal_$identifier$_descriptor;\n"
    "}\n"
    "\n",
    "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "identifier", UniqueFileScopeIdentifier(descriptor_));

  // LITE runtime implements this in GeneratedMessageLite.
  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return $classname$.getDefaultInstance();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "public $classname$ build() {\n"
    "  $classname$ result = buildPartial();\n"
    "  if (!result.isInitialized()) {\n"
    "    throw newUninitializedMessageException(result);\n"
    "  }\n"
    "  return result;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "public $classname$ buildPartial() {\n"
    "  $classname$ result = new $classname$(this);\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();

  int totalBuilderBits = 0;
  int totalMessageBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
    totalMessageBits += field.GetNumBitsForMessage();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  int totalMessageInts = (totalMessageBits + 31) / 32;

  if (GenerateHasBits(descriptor_)) {
    // Local vars for from and to bit fields to avoid accessing the builder and
    // message over and over for these fields. Seems to provide a slight
    // perforamance improvement in micro benchmark and this is also what proto1
    // code does.
    for (int i = 0; i < totalBuilderInts; i++) {
      printer->Print("int from_$bit_field_name$ = $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
    for (int i = 0; i < totalMessageInts; i++) {
      printer->Print("int to_$bit_field_name$ = 0;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // Output generation code for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateBuildingCode(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Copy the bit field results to the generated message
    for (int i = 0; i < totalMessageInts; i++) {
      printer->Print("result.$bit_field_name$ = to_$bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print("result.$oneof_name$Case_ = $oneof_name$Case_;\n",
                   "oneof_name", context_->GetOneofGeneratorInfo(
                       descriptor_->oneof_decl(i))->name);
  }

  printer->Outdent();

  printer->Print(
    "  onBuilt();\n");

  printer->Print(
    "  return result;\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Override methods declared in GeneratedMessage to return the concrete
  // generated type so callsites won't depend on GeneratedMessage. This
  // is needed to keep binary compatibility when we change generated code
  // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
  // we changed all generated code to subclass GeneratedMessageV3).
  printer->Print(
    "public Builder clone() {\n"
    "  return (Builder) super.clone();\n"
    "}\n"
    "public Builder setField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    Object value) {\n"
    "  return (Builder) super.setField(field, value);\n"
    "}\n"
    "public Builder clearField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field) {\n"
    "  return (Builder) super.clearField(field);\n"
    "}\n"
    "public Builder clearOneof(\n"
    "    com.google.protobuf.Descriptors.OneofDescriptor oneof) {\n"
    "  return (Builder) super.clearOneof(oneof);\n"
    "}\n"
    "public Builder setRepeatedField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    int index, Object value) {\n"
    "  return (Builder) super.setRepeatedField(field, index, value);\n"
    "}\n"
    "public Builder addRepeatedField(\n"
    "    com.google.protobuf.Descriptors.FieldDescriptor field,\n"
    "    Object value) {\n"
    "  return (Builder) super.addRepeatedField(field, value);\n"
    "}\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "public <Type> Builder setExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, Type> extension,\n"
      "    Type value) {\n"
      "  return (Builder) super.setExtension(extension, value);\n"
      "}\n"
      "public <Type> Builder setExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, java.util.List<Type>> extension,\n"
      "    int index, Type value) {\n"
      "  return (Builder) super.setExtension(extension, index, value);\n"
      "}\n"
      "public <Type> Builder addExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, java.util.List<Type>> extension,\n"
      "    Type value) {\n"
      "  return (Builder) super.addExtension(extension, value);\n"
      "}\n"
      "public <Type> Builder clearExtension(\n"
      "    com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
      "        $classname$, ?> extension) {\n"
      "  return (Builder) super.clearExtension(extension);\n"
      "}\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
  }

  // -----------------------------------------------------------------

  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
      "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
      "  if (other instanceof $classname$) {\n"
      "    return mergeFrom(($classname$)other);\n"
      "  } else {\n"
      "    super.mergeFrom(other);\n"
      "    return this;\n"
      "  }\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

    printer->Print(
      "public Builder mergeFrom($classname$ other) {\n"
      // Optimization:  If other is the default instance, we know none of its
      //   fields are set so we can skip the merge.
      "  if (other == $classname$.getDefaultInstance()) return this;\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!descriptor_->field(i)->containing_oneof()) {
        field_generators_.get(
            descriptor_->field(i)).GenerateMergingCode(printer);
      }
    }

    // Merge oneof fields.
    for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
      printer->Print(
        "switch (other.get$oneof_capitalized_name$Case()) {\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(
            descriptor_->oneof_decl(i))->capitalized_name);
      printer->Indent();
      for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
        printer->Print(
          "case $field_name$: {\n",
          "field_name",
          ToUpper(field->name()));
        printer->Indent();
        field_generators_.get(field).GenerateMergingCode(printer);
        printer->Print(
            "break;\n");
        printer->Outdent();
        printer->Print(
            "}\n");
      }
      printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(context_->GetOneofGeneratorInfo(
            descriptor_->oneof_decl(i))->name));
      printer->Outdent();
      printer->Print(
          "}\n");
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print(
        "  this.mergeExtensionFields(other);\n");
    }

    if (PreserveUnknownFields(descriptor_)) {
      printer->Print(
        "  this.mergeUnknownFields(other.unknownFields);\n");
    }

    printer->Print(
      "  onChanged();\n");

    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }
}